

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_gen.c
# Opt level: O0

param_2 * parse_param_2(char *type)

{
  param_2 *ppVar1;
  char *pcVar2;
  double dVar3;
  param_2 *params;
  char *tok;
  char *type_local;
  
  ppVar1 = (param_2 *)malloc(0x10);
  if (ppVar1 != (param_2 *)0x0) {
    strtok(type,":");
    pcVar2 = strtok((char *)0x0,":");
    dVar3 = atof(pcVar2);
    ppVar1->a = dVar3;
    pcVar2 = strtok((char *)0x0,":");
    dVar3 = atof(pcVar2);
    ppVar1->b = dVar3;
    return ppVar1;
  }
  __assert_fail("params",
                "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/rand_gen.c"
                ,0x12f,"struct param_2 *parse_param_2(char *)");
}

Assistant:

static struct param_2 *parse_param_2(char *type)
{
	char *tok;
	struct param_2 *params;

	params = (struct param_2 *)malloc(sizeof(struct param_2));
	assert(params);

	tok = strtok(type, ":");
	tok = strtok(NULL, ":");
	params->a = atof(tok);
	tok = strtok(NULL, ":");
	params->b = atof(tok);

	return params;
}